

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O3

void __thiscall
slang::SVInt::initSlowCase(SVInt *this,span<const_std::byte,_18446744073709551615UL> bytes)

{
  bool bVar1;
  uint uVar2;
  SVInt *__s;
  __extent_storage<18446744073709551615UL> _Var3;
  __extent_storage<18446744073709551615UL> __n;
  ulong n;
  
  _Var3 = bytes._M_extent._M_extent_value;
  uVar2 = (this->super_SVIntStorage).bitWidth;
  bVar1 = (this->super_SVIntStorage).unknownFlag;
  if (uVar2 < 0x41 && (bVar1 & 1U) == 0) {
    (this->super_SVIntStorage).field_0.val = 0;
    __n._M_extent_value = 8;
    __s = this;
    if (_Var3._M_extent_value < 8) {
      __n._M_extent_value = _Var3._M_extent_value;
    }
  }
  else {
    n = (ulong)(((uVar2 + 0x3f >> 6) << (bVar1 & 0x1fU)) << 3);
    __s = (SVInt *)operator_new__(n);
    memset(__s,0,n);
    (this->super_SVIntStorage).field_0.pVal = (uint64_t *)__s;
    __n._M_extent_value = _Var3._M_extent_value;
    if (n < _Var3._M_extent_value) {
      __n._M_extent_value = n;
    }
  }
  memcpy(__s,bytes._M_ptr,__n._M_extent_value);
  clearUnusedBits(this);
  return;
}

Assistant:

void SVInt::initSlowCase(std::span<const byte> bytes) {
    if (isSingleWord()) {
        val = 0;
        memcpy(&val, bytes.data(), std::min<size_t>(WORD_SIZE, bytes.size()));
    }
    else {
        uint32_t words = getNumWords();
        pVal = new uint64_t[words](); // allocation is zero cleared
        memcpy(pVal, bytes.data(), std::min<size_t>(words * WORD_SIZE, bytes.size()));
    }
    clearUnusedBits();
}